

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_relative_location_path
              (lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,int all_desc,
              lyxp_set *set,int options)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  LY_ERR *pLVar4;
  bool bVar5;
  int local_48;
  int local_44;
  int ret;
  int attr_axis;
  lyxp_set *set_local;
  int all_desc_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  set_local._4_4_ = all_desc;
  do {
    local_44 = 0;
    switch(exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_DOT:
      if ((set == (lyxp_set *)0x0) || ((options & 0x1cU) == 0)) {
        local_48 = moveto_self(set,cur_node,set_local._4_4_,options);
      }
      else {
        local_48 = moveto_snode_self(set,(lys_node *)cur_node,set_local._4_4_,options);
      }
      if (local_48 != 0) {
        return local_48;
      }
      if ('\x02' < ly_log_level) {
        pcVar2 = "skipped";
        if (set != (lyxp_set *)0x0) {
          pcVar2 = "parsed";
        }
        pcVar3 = print_token(exp->tokens[*exp_idx]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",pcVar2,pcVar3,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      *exp_idx = *exp_idx + 1;
      break;
    case LYXP_TOKEN_DDOT:
      if ((set == (lyxp_set *)0x0) || ((options & 0x1cU) == 0)) {
        local_48 = moveto_parent(set,cur_node,set_local._4_4_,options);
      }
      else {
        local_48 = moveto_snode_parent(set,(lys_node *)cur_node,set_local._4_4_,options);
      }
      if (local_48 != 0) {
        return local_48;
      }
      if ('\x02' < ly_log_level) {
        pcVar2 = "skipped";
        if (set != (lyxp_set *)0x0) {
          pcVar2 = "parsed";
        }
        pcVar3 = print_token(exp->tokens[*exp_idx]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",pcVar2,pcVar3,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      *exp_idx = *exp_idx + 1;
      break;
    case LYXP_TOKEN_AT:
      local_44 = 1;
      if ('\x02' < ly_log_level) {
        pcVar2 = "skipped";
        if (set != (lyxp_set *)0x0) {
          pcVar2 = "parsed";
        }
        pcVar3 = print_token(exp->tokens[*exp_idx]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",pcVar2,pcVar3,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      *exp_idx = *exp_idx + 1;
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
      iVar1 = eval_node_test(exp,exp_idx,cur_node,param_4,local_44,set_local._4_4_,set,options);
      while( true ) {
        if (iVar1 != 0) {
          return iVar1;
        }
        bVar5 = false;
        if (*exp_idx < exp->used) {
          bVar5 = exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1;
        }
        if (!bVar5) break;
        iVar1 = eval_predicate(exp,exp_idx,cur_node,param_4,set,options);
      }
      break;
    default:
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             0x17ee);
      return -1;
    }
    bVar5 = false;
    if (*exp_idx < exp->used) {
      bVar5 = exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH;
    }
    if (!bVar5) {
      return 0;
    }
    if (exp->tok_len[*exp_idx] == '\x01') {
      set_local._4_4_ = 0;
    }
    else {
      if (exp->tok_len[*exp_idx] != '\x02') {
        __assert_fail("exp->tok_len[*exp_idx] == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x17b0,
                      "int eval_relative_location_path(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, struct lyxp_set *, int)"
                     );
      }
      set_local._4_4_ = 1;
    }
    if ('\x02' < ly_log_level) {
      pcVar2 = "skipped";
      if (set != (lyxp_set *)0x0) {
        pcVar2 = "parsed";
      }
      pcVar3 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",pcVar2,pcVar3,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
  } while( true );
}

Assistant:

static int
eval_relative_location_path(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                            int all_desc, struct lyxp_set *set, int options)
{
    int attr_axis, ret;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

step:
        /* Step */
        attr_axis = 0;
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_self(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_self(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;
        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_parent(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_parent(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            /* evaluate '@' */
            attr_axis = 1;
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);

            /* fall through */
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            ret = eval_node_test(exp, exp_idx, cur_node, local_mod, attr_axis, all_desc, set, options);
            if (ret) {
                return ret;
            }
            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options);
                if (ret) {
                    return ret;
                }
            }
            break;
        default:
            LOGINT;
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}